

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O2

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::Expand
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,BGIP_BnB_NodePtr *node,Index JA)

{
  uint jTypeI;
  pointer pvVar1;
  pointer puVar2;
  pointer puVar3;
  BGIP_BnB_Node *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  ostream *poVar5;
  uint uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  BGIP_BnB_NodePtr nodeExtend;
  BGIP_BnB_NodePtr local_60;
  string local_50 [32];
  
  pvVar1 = (this->_m_jaToIndCache).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (BGIP_BnB_Node *)operator_new(0x40);
  BGIP_BnB_Node::BGIP_BnB_Node(this_00,node->px);
  boost::shared_ptr<BGIP_BnB_Node>::shared_ptr<BGIP_BnB_Node>(&nodeExtend,this_00);
  *(int *)(nodeExtend.px + 0x20) = *(int *)(node->px + 0x20) + 1;
  boost::shared_ptr<BGIP_BnB_Node>::operator=((shared_ptr<BGIP_BnB_Node> *)nodeExtend.px,node);
  this->_m_nrNodesExpanded = this->_m_nrNodesExpanded + 1;
  jTypeI = (this->_m_jtIndexMapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start[*(uint *)(node->px + 0x20)];
  pvVar4 = BayesianGameBase::JointToIndividualTypeIndices
                     ((BayesianGameBase *)(this->_m_bgip).px,jTypeI);
  puVar2 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar6 = 0; uVar7 = (ulong)uVar6, (long)puVar2 - (long)puVar3 >> 2 != uVar7; uVar6 = uVar6 + 1
      ) {
    *(undefined4 *)(*(long *)(nodeExtend.px + 0x28) + uVar7 * 4) =
         *(undefined4 *)
          (*(long *)&pvVar1[JA].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data + uVar7 * 4);
  }
  if (this->_m_reComputeH == false) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (this->_m_completeInformationValues).super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_start[jTypeI];
    auVar8._8_8_ = 0x8000000000000000;
    auVar8._0_8_ = 0x8000000000000000;
    auVar8 = vxorpd_avx512vl(auVar10,auVar8);
    BGIP_BnB_Node::UpdateH(auVar8._0_8_);
  }
  else {
    local_60.px = nodeExtend.px;
    local_60.pn.pi_ = nodeExtend.pn.pi_;
    if (nodeExtend.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (nodeExtend.pn.pi_)->use_count_ = (nodeExtend.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    ReComputeH(this,&local_60);
    boost::detail::shared_count::~shared_count(&local_60.pn);
  }
  dVar9 = GetContribution(this,jTypeI,JA);
  BGIP_BnB_Node::UpdateG(dVar9);
  if (4 < this->_m_verbosity) {
    poVar5 = std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound Adding node: ");
    BGIP_BnB_Node::SoftPrint_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,local_50);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string(local_50);
  }
  if (this->_m_CBGlowerBound <= *(double *)(node->px + 0x10) + *(double *)(node->px + 0x18)) {
    std::
    priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
    ::push(this->_m_openQueue,&nodeExtend);
  }
  else {
    this->_m_nrNodesPruned = this->_m_nrNodesPruned + 1;
  }
  boost::detail::shared_count::~shared_count(&nodeExtend.pn);
  return;
}

Assistant:

void Expand(BGIP_BnB_NodePtr node, Index JA)
    {
        const std::vector<Index> &ja=_m_jaToIndCache[JA];
        
        // Create a new node, copy from its parent
        BGIP_BnB_NodePtr nodeExtend=BGIP_BnB_NodePtr(new BGIP_BnB_Node(*node));

        nodeExtend->SetDepth( node->GetDepth() + 1 );
#if INCR_EXPAND
        nodeExtend->ClearAlreadyExpanded();
#endif
        nodeExtend->SetParent(node);
        _m_nrNodesExpanded++;
        
        //jt_oI of *nodeExtended* is *node*->GetDepth
        Index jt_oI = node->GetDepth();
        Index jt_bgI = _m_jtIndexMapping[jt_oI];
        
        // update the new nodes joint policy
        const std::vector<Index> &indTypes=
            _m_bgip->JointToIndividualTypeIndices(jt_bgI);
        for(Index agI=0;agI!=indTypes.size();++agI)
        {
#if MAINTAIN_FULL_POL        
            nodeExtend->SetAction(agI,indTypes[agI],ja[agI]);
#else
            nodeExtend->SetAction(agI,ja[agI]);
#endif

#if CACHE_IMPLIED_JPOL
            //update the implied policy:
            //(this is used by ReComputeH below!)
            _m_impliedJPol[agI][ indTypes[agI] ] = ja[agI];
#endif
        }
        
        // update the G and H values, which automatically updates F:
        if(_m_reComputeH)
            ReComputeH(nodeExtend);
        else
        {
            // first we substract the heuristic CI value for the
            // current joint type
            nodeExtend->UpdateH(-_m_completeInformationValues[jt_bgI]);
        }
        // then we add the real value to G
        nodeExtend->UpdateG(GetContribution(jt_bgI,JA));
                
        if(_m_verbosity>4)
            std::cout << "BGIP_SolverBranchAndBound Adding node: "
                      << nodeExtend->SoftPrint() << std::endl;
        
#if INCR_EXPAND
        // keep track of already expanded nodes
        node->SetAlreadyExpanded(JA);
#endif

        if(node->GetF() < _m_CBGlowerBound)
            _m_nrNodesPruned++; // do nothing, by not putting it on the
                                // queue it will be deleted
        else
            // add the node to the queue
            _m_openQueue->push(nodeExtend);
    }